

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::anon_unknown_14::fpToString<long_double>(longdouble value,int precision)

{
  ostream *this;
  void *this_00;
  long lVar1;
  long lVar2;
  int in_ESI;
  String *in_RDI;
  longdouble in_stack_00000008;
  size_t i;
  string d;
  ostringstream oss;
  char *in_stack_fffffffffffffdc8;
  String *in_stack_fffffffffffffdd0;
  string local_1f8 [32];
  long local_1d8;
  string local_1d0 [52];
  int local_19c;
  ostringstream local_198 [380];
  int local_1c;
  longdouble local_18;
  
  local_18 = in_stack_00000008;
  local_1c = in_ESI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_19c = (int)std::setprecision(local_1c);
  this = std::operator<<((ostream *)local_198,(_Setprecision)local_19c);
  this_00 = (void *)std::ostream::operator<<(this,std::fixed);
  std::ostream::operator<<(this_00,local_18);
  std::__cxx11::ostringstream::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)local_1d0,0x30);
  local_1d8 = lVar1;
  if (lVar1 != -1) {
    lVar2 = std::__cxx11::string::size();
    if (lVar1 != lVar2 + -1) {
      in_stack_fffffffffffffdd0 = (String *)std::__cxx11::string::operator[]((ulong)local_1d0);
      if ((in_stack_fffffffffffffdd0->field_0).buf[0] == '.') {
        local_1d8 = local_1d8 + 1;
      }
      std::__cxx11::string::substr((ulong)local_1f8,(ulong)local_1d0);
      std::__cxx11::string::operator=(local_1d0,local_1f8);
      std::__cxx11::string::~string(local_1f8);
    }
  }
  std::__cxx11::string::c_str();
  String::String(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

String fpToString(T value, int precision) {
        std::ostringstream oss;
        oss << std::setprecision(precision) << std::fixed << value;
        std::string d = oss.str();
        size_t      i = d.find_last_not_of('0');
        if(i != std::string::npos && i != d.size() - 1) {
            if(d[i] == '.')
                i++;
            d = d.substr(0, i + 1);
        }
        return d.c_str();
    }